

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

bool testMethod_substr_AtStart(String *str)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string *psVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  String substr;
  
  cm::String::substr(&substr,str,0,2);
  if (substr.view_._M_str == (str->view_)._M_str) {
    if (substr.view_._M_len == 2) {
      pcVar3 = cm::String::c_str(&substr);
      if (((*pcVar3 == 'a') && (pcVar3[1] == 'b')) && (pcVar3[2] == '\0')) {
        pcVar5 = (str->view_)._M_str;
        if (pcVar3 == pcVar5) {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(substr_c != str.data()) failed on line ");
          iVar7 = 0x335;
        }
        else if (substr.view_._M_str == pcVar5) {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(substr.data() != str.data()) failed on line ");
          iVar7 = 0x336;
        }
        else if (substr.view_._M_len == 2) {
          bVar1 = cm::String::is_stable(&substr);
          if (bVar1) {
            psVar4 = cm::String::str_abi_cxx11_(&substr);
            bVar1 = std::operator==(psVar4,"ab");
            if (bVar1) {
              bVar1 = cm::String::is_stable(&substr);
              if (bVar1) {
                if (substr.view_._M_str == pcVar3) {
                  if (substr.view_._M_len == 2) {
                    pcVar5 = cm::String::c_str(&substr);
                    if (pcVar5 == pcVar3) {
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&substr.string_.
                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      cm::String::substr(&substr,str,0,2);
                      if (substr.view_._M_str == (str->view_)._M_str) {
                        if (substr.view_._M_len != 2) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                   "ASSERT_TRUE(substr.size() == 2) failed on line "
                                                  );
                          iVar7 = 0x345;
                          goto LAB_0017a189;
                        }
                        bVar1 = cm::String::is_stable(&substr);
                        if (bVar1) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(!substr.is_stable()) failed on line "
                                                  );
                          iVar7 = 0x346;
                          goto LAB_0017a189;
                        }
                        psVar4 = cm::String::str_abi_cxx11_(&substr);
                        bVar1 = std::operator==(psVar4,"ab");
                        if (!bVar1) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(substr.str() == \"ab\") failed on line "
                                                  );
                          iVar7 = 0x349;
                          goto LAB_0017a189;
                        }
                        bVar1 = cm::String::is_stable(&substr);
                        if (!bVar1) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                   "ASSERT_TRUE(substr.is_stable()) failed on line "
                                                  );
                          iVar7 = 0x34a;
                          goto LAB_0017a189;
                        }
                        if (substr.view_._M_str == (str->view_)._M_str) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(substr.data() != str.data()) failed on line "
                                                  );
                          iVar7 = 0x34b;
                          goto LAB_0017a189;
                        }
                        if (substr.view_._M_len != 2) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                   "ASSERT_TRUE(substr.size() == 2) failed on line "
                                                  );
                          iVar7 = 0x34c;
                          goto LAB_0017a189;
                        }
                        pcVar3 = cm::String::c_str(&substr);
                        if (pcVar3 == (str->view_)._M_str) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(substr.c_str() != str.data()) failed on line "
                                                  );
                          iVar7 = 0x34d;
                          goto LAB_0017a189;
                        }
                        pcVar3 = cm::String::c_str(&substr);
                        if (((*pcVar3 == 'a') && (pcVar3[1] == 'b')) && (pcVar3[2] == '\0')) {
                          if (pcVar3 == substr.view_._M_str) {
                            if (substr.view_._M_len == 2) {
                              bVar1 = cm::String::is_stable(&substr);
                              bVar6 = true;
                              if (bVar1) goto LAB_0017a1a2;
                              poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(substr.is_stable()) failed on line ")
                              ;
                              iVar7 = 0x354;
                            }
                            else {
                              poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(substr.size() == 2) failed on line ")
                              ;
                              iVar7 = 0x353;
                            }
                          }
                          else {
                            poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(substr_c == substr.data()) failed on line "
                                                  );
                            iVar7 = 0x352;
                          }
                        }
                        else {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(std::strcmp(substr_c, \"ab\") == 0) failed on line "
                                                  );
                          iVar7 = 0x351;
                        }
                        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
                        std::operator<<(poVar2,"\n");
                      }
                      else {
                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(substr.data() == str.data()) failed on line "
                                                );
                        iVar7 = 0x344;
LAB_0017a189:
                        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
                        std::operator<<(poVar2,"\n");
                      }
                      bVar6 = false;
LAB_0017a1a2:
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&substr.string_.
                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      return bVar6;
                    }
                    poVar2 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(substr.c_str() == substr_c) failed on line "
                                            );
                    iVar7 = 0x33f;
                  }
                  else {
                    poVar2 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(substr.size() == 2) failed on line ");
                    iVar7 = 0x33e;
                  }
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(substr.data() == substr_c) failed on line ")
                  ;
                  iVar7 = 0x33d;
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(substr.is_stable()) failed on line ");
                iVar7 = 0x33c;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(substr.str() == \"ab\") failed on line ");
              iVar7 = 0x33b;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(substr.is_stable()) failed on line ");
            iVar7 = 0x338;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(substr.size() == 2) failed on line ");
          iVar7 = 0x337;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(std::strcmp(substr_c, \"ab\") == 0) failed on line ");
        iVar7 = 0x334;
      }
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
      std::operator<<(poVar2,"\n");
      goto LAB_00179f58;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line "
                            );
    iVar7 = 0x330;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(substr.data() == str.data()) failed on line ");
    iVar7 = 0x32f;
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
  std::operator<<(poVar2,"\n");
LAB_00179f58:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&substr.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return false;
}

Assistant:

static bool testMethod_substr_AtStart(cm::String str)
{
  {
    cm::String substr = str.substr(0, 2);
    ASSERT_TRUE(substr.data() == str.data());
    ASSERT_TRUE(substr.size() == 2);

    // c_str() not at the end of the buffer internally mutates.
    const char* substr_c = substr.c_str();
    ASSERT_TRUE(std::strcmp(substr_c, "ab") == 0);
    ASSERT_TRUE(substr_c != str.data());
    ASSERT_TRUE(substr.data() != str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.is_stable());

    // str() does not need to internally mutate after c_str() did so
    ASSERT_TRUE(substr.str() == "ab");
    ASSERT_TRUE(substr.is_stable());
    ASSERT_TRUE(substr.data() == substr_c);
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.c_str() == substr_c);
  }

  {
    cm::String substr = str.substr(0, 2);
    ASSERT_TRUE(substr.data() == str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(!substr.is_stable());

    // str() internally mutates.
    ASSERT_TRUE(substr.str() == "ab");
    ASSERT_TRUE(substr.is_stable());
    ASSERT_TRUE(substr.data() != str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.c_str() != str.data());

    // c_str() does not internally after str() did so
    const char* substr_c = substr.c_str();
    ASSERT_TRUE(std::strcmp(substr_c, "ab") == 0);
    ASSERT_TRUE(substr_c == substr.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.is_stable());
  }

  return true;
}